

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O0

action_t __thiscall helics::BrokerBase::commandProcessor(BrokerBase *this,ActionMessage *command)

{
  string_view data;
  bool bVar1;
  action_t aVar2;
  BrokerBase *in_RSI;
  ActionMessage *in_RDI;
  __sv_type _Var3;
  action_t commandAction;
  ActionMessage NMess;
  int ii;
  undefined4 in_stack_fffffffffffffee8;
  ActionMessage *in_stack_fffffffffffffef0;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffff04;
  int iVar5;
  action_t in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  size_t in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar6;
  action_t local_4;
  
  aVar2 = ActionMessage::action((ActionMessage *)in_RSI);
  if (aVar2 != cmd_ignore) {
    if ((((aVar2 == cmd_tick) || ((uint)(aVar2 + (cmd_add_route|cmd_user_disconnect)) < 2)) ||
        (aVar2 == cmd_base_configure)) || (aVar2 == cmd_ping)) {
LAB_0044c1a2:
      aVar2 = ActionMessage::action((ActionMessage *)in_RSI);
      return aVar2;
    }
    if (aVar2 == cmd_multi_message) {
      uVar4 = 0x40d;
      for (iVar6 = 0; iVar5 = (int)((ulong)in_stack_fffffffffffffef0 >> 0x20),
          iVar6 < (int)(uint)*(ushort *)&in_RSI->minFederateCount; iVar6 = iVar6 + 1) {
        ActionMessage::ActionMessage((ActionMessage *)CONCAT44(in_stack_ffffffffffffff04,uVar4));
        in_stack_fffffffffffffef0 =
             (ActionMessage *)ActionMessage::getString_abi_cxx11_(in_RDI,iVar5);
        _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffef0);
        data._M_str = (char *)_Var3._M_len;
        data._M_len = in_stack_ffffffffffffff10;
        ActionMessage::from_string
                  ((ActionMessage *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                   data);
        in_stack_ffffffffffffff08 =
             commandProcessor(in_RSI,(ActionMessage *)CONCAT44(iVar6,in_stack_ffffffffffffffe0));
        if ((in_stack_ffffffffffffff08 == cmd_ignore) || (in_stack_ffffffffffffff08 == cmd_tick)) {
          iVar5 = 0;
        }
        else {
          ActionMessage::operator=
                    (in_stack_fffffffffffffef0,
                     (ActionMessage *)CONCAT44(in_stack_ffffffffffffff08,in_stack_fffffffffffffee8))
          ;
          iVar5 = 1;
          local_4 = in_stack_ffffffffffffff08;
        }
        ActionMessage::~ActionMessage(in_stack_fffffffffffffef0);
        if (iVar5 != 0) {
          return local_4;
        }
        in_stack_ffffffffffffff04 = 0;
      }
    }
    else {
      if (aVar2 == cmd_error_check) goto LAB_0044c1a2;
      bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_RDI);
      if (!bVar1) {
        bVar1 = isPriorityCommand((ActionMessage *)0x44c2fd);
        if (bVar1) {
          (**(code **)(*(long *)in_RDI + 0x30))(in_RDI,in_RSI);
        }
        else {
          (**(code **)(*(long *)in_RDI + 0x28))(in_RDI,in_RSI);
        }
      }
    }
  }
  return cmd_ignore;
}

Assistant:

action_message_def::action_t BrokerBase::commandProcessor(ActionMessage& command)
{
    switch (command.action()) {
        case CMD_IGNORE:
            break;
        case CMD_TERMINATE_IMMEDIATELY:
        case CMD_STOP:
        case CMD_TICK:
        case CMD_BASE_CONFIGURE:
        case CMD_PING:
        case CMD_ERROR_CHECK:
            return command.action();
        case CMD_MULTI_MESSAGE:
            for (int ii = 0; ii < command.counter; ++ii) {
                ActionMessage NMess;
                NMess.from_string(command.getString(ii));
                auto commandAction = commandProcessor(NMess);
                if (commandAction != CMD_IGNORE) {
                    // overwrite the abort command but ignore ticks in a multi-message context
                    // they shouldn't be there
                    if (commandAction != CMD_TICK) {
                        command = NMess;
                        return commandAction;
                    }
                }
            }
            break;
        default:
            if (!haltOperations) {
                if (isPriorityCommand(command)) {
                    processPriorityCommand(std::move(command));
                } else {
                    processCommand(std::move(command));
                }
            }
    }
    return CMD_IGNORE;
}